

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86_avx512::create_pipeline(Convolution1D_x86_avx512 *this,Option *opt)

{
  int _c;
  _func_int **pp_Var1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined4 *puVar9;
  int i;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  undefined4 *puVar14;
  long lVar15;
  undefined4 *puVar16;
  _func_int *p_Var17;
  undefined4 *puVar18;
  undefined4 *puVar19;
  undefined8 unaff_R14;
  long lVar20;
  uint _h;
  ulong uVar21;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Mat local_78;
  uint uVar22;
  uint uVar25;
  
  p_Var17 = this->_vptr_Convolution1D_x86_avx512[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var17) == 0) {
    _c = *(int *)(&this->field_0xd0 + (long)p_Var17);
    uVar13 = (long)*(int *)(&this->field_0xf0 + (long)p_Var17) /
             (long)*(int *)(&this->field_0xd4 + (long)p_Var17);
    uVar13 = (long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff) / (long)_c;
    _h = (uint)uVar13;
    if (opt->use_packing_layout == true) {
      auVar23 = vpinsrd_avx(ZEXT416(_h),_c,1);
      auVar24._8_4_ = 7;
      auVar24._0_8_ = 0x700000007;
      auVar24._12_4_ = 7;
      uVar11 = vptestnmd_avx512vl(auVar23,auVar24);
      auVar8._8_4_ = 3;
      auVar8._0_8_ = 0x300000003;
      auVar8._12_4_ = 3;
      uVar21 = vptestnmd_avx512vl(auVar23,auVar8);
      auVar23 = vpbroadcastd_avx512vl(ZEXT416(4));
      bVar5 = (bool)((byte)(uVar21 & 0xf) & 1);
      bVar7 = (bool)((byte)((uVar21 & 0xf) >> 1) & 1);
      auVar24 = vpbroadcastd_avx512vl(ZEXT416(8));
      bVar6 = (bool)((byte)(uVar11 & 0xf) & 1);
      uVar22 = (uint)bVar6 * auVar24._0_4_ |
               (uint)!bVar6 * ((uint)bVar5 * auVar23._0_4_ | (uint)!bVar5);
      bVar5 = (bool)((byte)((uVar11 & 0xf) >> 1) & 1);
      uVar25 = (uint)bVar5 * auVar24._4_4_ |
               (uint)!bVar5 * ((uint)bVar7 * auVar23._4_4_ | (uint)!bVar7);
    }
    else {
      uVar22 = 1;
      uVar25 = 1;
    }
    Mat::reshape(&local_78,(Mat *)(&this->field_0x148 + (long)p_Var17),
                 *(int *)(&this->field_0xd4 + (long)p_Var17),_h,_c,(Allocator *)0x0);
    lVar20 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar22);
    uVar11 = (ulong)uVar25;
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86_avx512[-3]),
                (int)((long)((ulong)(uint)((int)_h >> 0x1f) << 0x20 | uVar13 & 0xffffffff) /
                     (long)(int)uVar22),
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx512[-3]) /
                (int)uVar25,lVar20 * uVar11 * 4,uVar25 * uVar22,(Allocator *)0x0);
    pp_Var1 = this->_vptr_Convolution1D_x86_avx512;
    p_Var17 = pp_Var1[-3];
    if ((int)uVar25 <= *(int *)(&this->field_0xd0 + (long)p_Var17)) {
      pvVar2 = (this->weight_data_packed).data;
      sVar3 = (this->weight_data_packed).cstep;
      sVar4 = (this->weight_data_packed).elemsize;
      uVar13 = 0;
      do {
        if ((int)uVar22 <= (int)_h) {
          puVar9 = (undefined4 *)
                   ((long)(int)((uVar13 & 0xffffffff) / (ulong)uVar25) * sVar3 * sVar4 +
                   (long)pvVar2);
          puVar14 = (undefined4 *)
                    (local_78.cstep * local_78.elemsize * uVar13 + (long)local_78.data);
          lVar15 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var17)) {
              lVar12 = 0;
              puVar16 = puVar14;
              do {
                lVar10 = 0;
                puVar19 = puVar16;
                uVar21 = uVar11;
                puVar18 = puVar16;
                do {
                  do {
                    *puVar9 = *puVar19;
                    puVar9 = puVar9 + 1;
                    uVar21 = uVar21 - 1;
                    puVar19 = (undefined4 *)((long)puVar19 + local_78.cstep * local_78.elemsize);
                  } while (uVar21 != 0);
                  lVar10 = lVar10 + 1;
                  puVar19 = (undefined4 *)((long)puVar18 + (long)local_78.w * local_78.elemsize);
                  uVar21 = uVar11;
                  puVar18 = puVar19;
                } while (lVar10 != lVar20);
                lVar12 = lVar12 + 1;
                p_Var17 = pp_Var1[-3];
                puVar16 = puVar16 + 1;
              } while (lVar12 < *(int *)(&this->field_0xd4 + (long)p_Var17));
            }
            lVar15 = lVar15 + lVar20;
            puVar14 = (undefined4 *)((long)puVar14 + (long)local_78.w * local_78.elemsize * lVar20);
          } while (lVar15 < (long)((long)(int)_h - (ulong)(uVar22 - 1)));
        }
        uVar13 = uVar13 + uVar11;
      } while ((long)((uVar25 - 1) + uVar13) < (long)*(int *)(&this->field_0xd0 + (long)p_Var17));
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}